

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O1

spv_result_t __thiscall
spvtools::val::anon_unknown_0::BuiltInsValidator::ValidateF32ArrHelper
          (BuiltInsValidator *this,Decoration *decoration,Instruction *inst,uint32_t num_components,
          function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *diag,uint32_t underlying_type)

{
  uint64_t uVar1;
  bool bVar2;
  uint32_t uVar3;
  spv_result_t sVar4;
  Instruction *pIVar5;
  ostream *poVar6;
  long *plVar7;
  undefined4 in_register_0000000c;
  Instruction *inst_00;
  size_type *psVar8;
  ulong uVar9;
  uint64_t actual_num_components;
  ostringstream ss;
  string local_1d0;
  uint64_t local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [3];
  ios_base local_138 [264];
  
  inst_00 = (Instruction *)CONCAT44(in_register_0000000c,num_components);
  pIVar5 = ValidationState_t::FindDef(this->_,underlying_type);
  if ((pIVar5->inst_).opcode == 0x1c) {
    uVar3 = (pIVar5->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_start[2];
    bVar2 = ValidationState_t::IsFloatScalarType(this->_,uVar3);
    if (bVar2) {
      uVar3 = ValidationState_t::GetBitWidth(this->_,uVar3);
      if (uVar3 == 0x20) {
        if (num_components != 0) {
          local_1b0 = 0;
          bVar2 = ValidationState_t::EvalConstantValUint64
                            (this->_,(pIVar5->words_).
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start[3],&local_1b0);
          uVar1 = local_1b0;
          if (!bVar2) {
            __assert_fail("0 && \"Array type definition is corrupt\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp"
                          ,0x468,
                          "spv_result_t spvtools::val::(anonymous namespace)::BuiltInsValidator::ValidateF32ArrHelper(const Decoration &, const Instruction &, uint32_t, const std::function<spv_result_t (const std::string &)> &, uint32_t)"
                         );
          }
          uVar9 = (ulong)num_components;
          if (local_1b0 != uVar9) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            (anonymous_namespace)::BuiltInsValidator::GetDefinitionDesc_abi_cxx11_
                      (&local_1d0,decoration,(Decoration *)inst,inst_00);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,local_1d0._M_dataplus._M_p,
                                local_1d0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," has ",5);
            poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," components.",0xc);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
              operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::stringbuf::str();
            if ((diag->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_001ac882;
            num_components = (*diag->_M_invoker)((_Any_data *)diag,&local_1d0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
              operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base(local_138);
          }
          if (uVar1 != uVar9) {
            return num_components;
          }
        }
        return SPV_SUCCESS;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      (anonymous_namespace)::BuiltInsValidator::GetDefinitionDesc_abi_cxx11_
                (&local_1d0,decoration,(Decoration *)inst,inst_00);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_1d0._M_dataplus._M_p,local_1d0._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6," has components with bit width ",0x1f);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,".",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringbuf::str();
      if ((diag->super__Function_base)._M_manager != (_Manager_type)0x0) {
        sVar4 = (*diag->_M_invoker)((_Any_data *)diag,&local_1d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        return sVar4;
      }
      goto LAB_001ac882;
    }
    (anonymous_namespace)::BuiltInsValidator::GetDefinitionDesc_abi_cxx11_
              (&local_1d0,decoration,(Decoration *)inst,inst_00);
  }
  else {
    (anonymous_namespace)::BuiltInsValidator::GetDefinitionDesc_abi_cxx11_
              (&local_1d0,decoration,(Decoration *)inst,inst_00);
  }
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_1d0);
  psVar8 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_1a8[0].field_2._0_8_ = *psVar8;
    local_1a8[0].field_2._8_4_ = (undefined4)plVar7[3];
    local_1a8[0].field_2._12_4_ = *(undefined4 *)((long)plVar7 + 0x1c);
    local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
  }
  else {
    local_1a8[0].field_2._0_8_ = *psVar8;
    local_1a8[0]._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_1a8[0]._M_string_length = plVar7[1];
  *plVar7 = (long)psVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if ((diag->super__Function_base)._M_manager != (_Manager_type)0x0) {
    sVar4 = (*diag->_M_invoker)((_Any_data *)diag,local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
    return sVar4;
  }
LAB_001ac882:
  std::__throw_bad_function_call();
}

Assistant:

spv_result_t BuiltInsValidator::ValidateF32ArrHelper(
    const Decoration& decoration, const Instruction& inst,
    uint32_t num_components,
    const std::function<spv_result_t(const std::string& message)>& diag,
    uint32_t underlying_type) {
  const Instruction* const type_inst = _.FindDef(underlying_type);
  if (type_inst->opcode() != spv::Op::OpTypeArray) {
    return diag(GetDefinitionDesc(decoration, inst) + " is not an array.");
  }

  const uint32_t component_type = type_inst->word(2);
  if (!_.IsFloatScalarType(component_type)) {
    return diag(GetDefinitionDesc(decoration, inst) +
                " components are not float scalar.");
  }

  const uint32_t bit_width = _.GetBitWidth(component_type);
  if (bit_width != 32) {
    std::ostringstream ss;
    ss << GetDefinitionDesc(decoration, inst)
       << " has components with bit width " << bit_width << ".";
    return diag(ss.str());
  }

  if (num_components != 0) {
    uint64_t actual_num_components = 0;
    if (!_.EvalConstantValUint64(type_inst->word(3), &actual_num_components)) {
      assert(0 && "Array type definition is corrupt");
    }
    if (actual_num_components != num_components) {
      std::ostringstream ss;
      ss << GetDefinitionDesc(decoration, inst) << " has "
         << actual_num_components << " components.";
      return diag(ss.str());
    }
  }

  return SPV_SUCCESS;
}